

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeMahonyFilter::getDefaultInternalInitialState
          (AttitudeMahonyFilter *this,Span<double,__1L> *stateBuffer)

{
  reference peVar1;
  long in_RDI;
  double idx;
  Span<double,__1L> *this_00;
  double dVar2;
  Span<double,__1L> *in_stack_ffffffffffffffa0;
  
  idx = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x80),0);
  peVar1 = Span<double,_-1L>::operator()(in_stack_ffffffffffffffa0,(index_type)idx);
  *peVar1 = idx;
  this_00 = (Span<double,__1L> *)
            VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x80),1);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = (element_type)this_00;
  dVar2 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x80),2);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x80),3);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xa0),0);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xa0),1);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xa0),2);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xb8),0);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xb8),1);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xb8),2);
  peVar1 = Span<double,_-1L>::operator()(this_00,(index_type)idx);
  *peVar1 = dVar2;
  return true;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::getDefaultInternalInitialState(const iDynTree::Span< double >& stateBuffer) const
{
    stateBuffer(0) = m_initial_state_mahony.m_orientation(0);
    stateBuffer(1) = m_initial_state_mahony.m_orientation(1);
    stateBuffer(2) = m_initial_state_mahony.m_orientation(2);
    stateBuffer(3) = m_initial_state_mahony.m_orientation(3);
    stateBuffer(4) = m_initial_state_mahony.m_angular_velocity(0);
    stateBuffer(5) = m_initial_state_mahony.m_angular_velocity(1);
    stateBuffer(6) = m_initial_state_mahony.m_angular_velocity(2);
    stateBuffer(7) = m_initial_state_mahony.m_gyroscope_bias(0);
    stateBuffer(8) = m_initial_state_mahony.m_gyroscope_bias(1);
    stateBuffer(9) = m_initial_state_mahony.m_gyroscope_bias(2);
    return true;
}